

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

string * deqp::gls::FboUtil::getExtensionDescription
                   (string *__return_storage_ptr__,string *extension)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GL_","");
  bVar2 = de::beginsWith(extension,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (extension->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + extension->_M_string_length);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)extension);
    if (iVar3 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "GLES3 compatible context";
      pcVar4 = "";
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)extension);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (iVar3 == 0) {
        pcVar5 = "GLES3.1 compatible context";
        pcVar4 = "";
      }
      else {
        pcVar4 = "";
        pcVar5 = "";
      }
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getExtensionDescription (const std::string& extension)
{
	if (de::beginsWith(extension, "GL_"))
		return extension;
	else if (extension == "DEQP_gles3_core_compatible")
		return "GLES3 compatible context";
	else if (extension == "DEQP_gles31_core_compatible")
		return "GLES3.1 compatible context";
	else
	{
		DE_ASSERT(false);
		return "";
	}
}